

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_4_channels_with_n_coeffs_mod1
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float *pfVar6;
  int iVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  pfVar1 = output_buffer + (output_sub_size << 2);
  pfVar8 = horizontal_coefficients + 4;
  do {
    lVar9 = (long)(horizontal_contributors->n0 * 4);
    pfVar6 = decode_buffer + lVar9;
    fVar12 = *horizontal_coefficients;
    fVar15 = horizontal_coefficients[1];
    fVar13 = horizontal_coefficients[2];
    fVar2 = horizontal_coefficients[3];
    fVar16 = fVar13 * pfVar6[8] + *pfVar6 * fVar12;
    fVar17 = fVar13 * pfVar6[9] + pfVar6[1] * fVar12;
    fVar18 = fVar13 * pfVar6[10] + pfVar6[2] * fVar12;
    fVar19 = fVar13 * pfVar6[0xb] + pfVar6[3] * fVar12;
    fVar12 = fVar2 * pfVar6[0xc] + fVar15 * pfVar6[4];
    fVar13 = fVar2 * pfVar6[0xd] + fVar15 * pfVar6[5];
    fVar14 = fVar2 * pfVar6[0xe] + fVar15 * pfVar6[6];
    fVar15 = fVar2 * pfVar6[0xf] + fVar15 * pfVar6[7];
    iVar7 = (~horizontal_contributors->n0 + horizontal_contributors->n1 >> 2) + 1;
    pfVar6 = decode_buffer + lVar9 + 0x10;
    pfVar11 = pfVar8;
    do {
      pfVar10 = pfVar6;
      fVar2 = *pfVar11;
      fVar3 = pfVar11[1];
      fVar4 = pfVar11[2];
      fVar5 = pfVar11[3];
      fVar16 = fVar4 * pfVar10[8] + *pfVar10 * fVar2 + fVar16;
      fVar17 = fVar4 * pfVar10[9] + pfVar10[1] * fVar2 + fVar17;
      fVar18 = fVar4 * pfVar10[10] + pfVar10[2] * fVar2 + fVar18;
      fVar19 = fVar4 * pfVar10[0xb] + pfVar10[3] * fVar2 + fVar19;
      fVar12 = fVar5 * pfVar10[0xc] + fVar3 * pfVar10[4] + fVar12;
      fVar13 = fVar5 * pfVar10[0xd] + fVar3 * pfVar10[5] + fVar13;
      fVar14 = fVar5 * pfVar10[0xe] + fVar3 * pfVar10[6] + fVar14;
      fVar15 = fVar5 * pfVar10[0xf] + fVar3 * pfVar10[7] + fVar15;
      iVar7 = iVar7 + -1;
      pfVar11 = pfVar11 + 4;
      pfVar6 = pfVar10 + 0x10;
    } while (1 < iVar7);
    fVar2 = *pfVar11;
    fVar3 = pfVar10[0x11];
    fVar4 = pfVar10[0x12];
    fVar5 = pfVar10[0x13];
    *output_buffer = fVar12 + fVar16 + pfVar10[0x10] * fVar2;
    output_buffer[1] = fVar13 + fVar17 + fVar3 * fVar2;
    output_buffer[2] = fVar14 + fVar18 + fVar4 * fVar2;
    output_buffer[3] = fVar15 + fVar19 + fVar5 * fVar2;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 4;
    pfVar8 = pfVar8 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod1 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 5 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__1_coeff_remnant( 4 );
    stbir__store_output();
  } while ( output < output_end );
}